

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void likeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3 *psVar1;
  compareInfo *pInfo;
  Mem *pMem;
  bool bVar2;
  int iVar3;
  u32 matchOther;
  u8 *zPattern;
  u8 *zString;
  byte *pbVar4;
  FuncDef *pFVar5;
  int iVar6;
  uchar *zEsc;
  byte *local_38;
  
  pFVar5 = context->pFunc;
  psVar1 = context->pOut->db;
  pInfo = (compareInfo *)pFVar5->pUserData;
  zPattern = (u8 *)sqlite3ValueText(*argv,'\x01');
  matchOther = (u32)pFVar5;
  zString = (u8 *)sqlite3ValueText(argv[1],'\x01');
  iVar3 = sqlite3ValueBytes(*argv,'\x01');
  if (psVar1->aLimit[8] < iVar3) {
    context->isError = 1;
    context->fErrorOrAux = '\x01';
    sqlite3VdbeMemSetStr
              (context->pOut,"LIKE or GLOB pattern too complex",-1,'\x01',
               (_func_void_void_ptr *)0xffffffffffffffff);
    return;
  }
  if (argc != 3) {
    matchOther = (u32)pInfo->matchSet;
    goto LAB_0017c844;
  }
  local_38 = (byte *)sqlite3ValueText(argv[2],'\x01');
  if (local_38 == (byte *)0x0) {
LAB_0017c833:
    bVar2 = false;
  }
  else {
    if (local_38 == (byte *)0xffffffffffffffff || *local_38 == 0) {
LAB_0017c808:
      context->isError = 1;
      context->fErrorOrAux = '\x01';
      matchOther = 1;
      sqlite3VdbeMemSetStr
                (context->pOut,"ESCAPE expression must be a single character",-1,'\x01',
                 (_func_void_void_ptr *)0xffffffffffffffff);
      goto LAB_0017c833;
    }
    pbVar4 = local_38;
    iVar3 = 0;
    do {
      iVar6 = iVar3;
      pbVar4 = pbVar4 + 1;
      if (pbVar4 == (byte *)0xffffffffffffffff) break;
      iVar3 = iVar6 + 1;
    } while (*pbVar4 != 0);
    if (iVar6 != 0) goto LAB_0017c808;
    matchOther = sqlite3Utf8Read(&local_38);
    bVar2 = true;
  }
  if (!bVar2) {
    return;
  }
LAB_0017c844:
  if (zPattern != (u8 *)0x0 && zString != (u8 *)0x0) {
    iVar3 = patternCompare(zPattern,zString,pInfo,matchOther);
    pMem = context->pOut;
    if ((pMem->flags & 0x2460) != 0) {
      vdbeReleaseAndSetInt64(pMem,(ulong)(iVar3 == 0));
      return;
    }
    (pMem->u).i = (ulong)(iVar3 == 0);
    pMem->flags = 4;
  }
  return;
}

Assistant:

static void likeFunc(
  sqlite3_context *context, 
  int argc, 
  sqlite3_value **argv
){
  const unsigned char *zA, *zB;
  u32 escape;
  int nPat;
  sqlite3 *db = sqlite3_context_db_handle(context);
  struct compareInfo *pInfo = sqlite3_user_data(context);

#ifdef SQLITE_LIKE_DOESNT_MATCH_BLOBS
  if( sqlite3_value_type(argv[0])==SQLITE_BLOB
   || sqlite3_value_type(argv[1])==SQLITE_BLOB
  ){
#ifdef SQLITE_TEST
    sqlite3_like_count++;
#endif
    sqlite3_result_int(context, 0);
    return;
  }
#endif
  zB = sqlite3_value_text(argv[0]);
  zA = sqlite3_value_text(argv[1]);

  /* Limit the length of the LIKE or GLOB pattern to avoid problems
  ** of deep recursion and N*N behavior in patternCompare().
  */
  nPat = sqlite3_value_bytes(argv[0]);
  testcase( nPat==db->aLimit[SQLITE_LIMIT_LIKE_PATTERN_LENGTH] );
  testcase( nPat==db->aLimit[SQLITE_LIMIT_LIKE_PATTERN_LENGTH]+1 );
  if( nPat > db->aLimit[SQLITE_LIMIT_LIKE_PATTERN_LENGTH] ){
    sqlite3_result_error(context, "LIKE or GLOB pattern too complex", -1);
    return;
  }
  assert( zB==sqlite3_value_text(argv[0]) );  /* Encoding did not change */

  if( argc==3 ){
    /* The escape character string must consist of a single UTF-8 character.
    ** Otherwise, return an error.
    */
    const unsigned char *zEsc = sqlite3_value_text(argv[2]);
    if( zEsc==0 ) return;
    if( sqlite3Utf8CharLen((char*)zEsc, -1)!=1 ){
      sqlite3_result_error(context, 
          "ESCAPE expression must be a single character", -1);
      return;
    }
    escape = sqlite3Utf8Read(&zEsc);
  }else{
    escape = pInfo->matchSet;
  }
  if( zA && zB ){
#ifdef SQLITE_TEST
    sqlite3_like_count++;
#endif
    sqlite3_result_int(context, patternCompare(zB, zA, pInfo, escape)==SQLITE_MATCH);
  }
}